

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# login1-server.c
# Opt level: O1

void ssh1_login_server_process_queue(PacketProtocolLayer *ppl)

{
  BinarySink *bs;
  BinarySource *src;
  void **ppvVar1;
  undefined1 *puVar2;
  byte *pbVar3;
  uint type;
  LogContext *pLVar4;
  PktInQueue *pPVar5;
  ptrlen username;
  ptrlen username_00;
  ptrlen username_01;
  ptrlen username_02;
  ptrlen username_03;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  _Bool _Var9;
  byte bVar10;
  uint uVar11;
  int iVar12;
  ProgressReceiverVtable *in_RAX;
  toplevel_callback_fn_t p_Var13;
  PrimeGenerationContext *pgc;
  unsigned_long uVar14;
  BinaryPacketProtocol *pBVar15;
  char *pcVar16;
  ulong uVar17;
  strbuf *outbuf;
  size_t sVar18;
  size_t sVar19;
  long lVar20;
  PktIn *pPVar21;
  void *__s;
  void *pvVar22;
  mp_int *pmVar23;
  RSAKey *pRVar24;
  mp_int *lo;
  mp_int *x;
  uchar *puVar25;
  ssh_hash *psVar26;
  PktOut *pPVar27;
  Ssh *pSVar28;
  ssh_cipheralg *cipher;
  char *pcVar29;
  size_t sVar30;
  ptrlen password;
  ptrlen pl2;
  ptrlen pl2_00;
  ptrlen bytes;
  ptrlen pVar31;
  ProgressReceiver null_progress;
  ProgressReceiver local_38;
  
  local_38.vt = in_RAX;
  _Var9 = ssh1_common_filter_queue(ppl);
  if (_Var9) {
    return;
  }
  iVar12 = *(int *)&ppl[-2].vt;
  if (0x10f < iVar12) {
    if (iVar12 == 0x110) goto LAB_0012f2aa;
    if (iVar12 == 0x164) goto LAB_0012f5f9;
    if (iVar12 == 0x192) goto LAB_0012f1bc;
LAB_0012ed2b:
    *(undefined4 *)&ppl[-2].vt = 0;
    return;
  }
  if (iVar12 == 0) {
    if (ppl[-1].ic_process_queue.fn == (toplevel_callback_fn_t)0x0) {
      iVar12 = *(int *)((long)ppl[-1].ic_process_queue.ctx + 4);
      p_Var13 = (toplevel_callback_fn_t)safemalloc(1,0x48,0);
      ppl[-1].ic_process_queue.fn = p_Var13;
      pgc = probprime_new_context(&primegen_probabilistic);
      local_38.vt = &null_progress_vt;
      rsa_generate((RSAKey *)ppl[-1].ic_process_queue.fn,
                   (uint)(iVar12 < 0x300) * 0x200 + iVar12 + -0x100,false,pgc,&local_38);
      (*pgc->vt->free_context)(pgc);
      *(undefined8 *)(ppl[-1].ic_process_queue.fn + 0x38) = 0;
      ppl[-1].ic_process_queue.queued = true;
    }
    *(undefined4 *)((long)&ppl[-2].out_pq + 4) = 0;
    pLVar4 = ppl[-1].logctx;
    ppl[-2].ic_process_queue.fn = (toplevel_callback_fn_t)ppl[-2].in_pq[3].pqb.end.prev;
    ppl[-2].ic_process_queue.ctx = (void *)0x0;
    uVar11 = auth_methods((AuthPolicy *)pLVar4);
    *(uint *)&ppl[-1].seat = uVar11;
    if ((uVar11 & 2) != 0) {
      ppvVar1 = &ppl[-2].ic_process_queue.ctx;
      *(byte *)ppvVar1 = *(byte *)ppvVar1 | 8;
    }
    if ((uVar11 & 4) != 0) {
      ppvVar1 = &ppl[-2].ic_process_queue.ctx;
      *(byte *)ppvVar1 = *(byte *)ppvVar1 | 4;
    }
    if ((uVar11 & 0x10) != 0) {
      ppvVar1 = &ppl[-2].ic_process_queue.ctx;
      *(byte *)ppvVar1 = *(byte *)ppvVar1 | 0x20;
    }
    if ((uVar11 & 0x20) != 0) {
      pbVar3 = (byte *)((long)&ppl[-2].ic_process_queue.ctx + 2);
      *pbVar3 = *pbVar3 | 1;
    }
    puVar2 = &ppl[-2].ic_process_queue.field_0x14;
    random_read(puVar2,8);
    pPVar27 = (*ppl->bpp->vt->new_pktout)(2);
    bs = pPVar27->binarysink_;
    BinarySink_put_data(bs,puVar2,8);
    rsa_ssh1_public_blob(bs,(RSAKey *)ppl[-1].ic_process_queue.fn,RSA_SSH1_EXPONENT_FIRST);
    rsa_ssh1_public_blob(bs,(RSAKey *)ppl[-1].ic_process_queue.ctx,RSA_SSH1_EXPONENT_FIRST);
    BinarySink_put_uint32(bs,(long)*(int *)((long)&ppl[-2].out_pq + 4));
    BinarySink_put_uint32(bs,(unsigned_long)ppl[-2].ic_process_queue.fn);
    BinarySink_put_uint32(bs,(unsigned_long)ppl[-2].ic_process_queue.ctx);
    pq_base_push(&ppl->out_pq->pqb,&pPVar27->qnode);
    *(undefined4 *)&ppl[-2].vt = 0xaf;
LAB_0012eeb2:
    _Var9 = ssh1_common_filter_queue(ppl);
    if (_Var9) {
      pPVar21 = (PktIn *)0x0;
    }
    else {
      pPVar5 = ppl->in_pq;
      pPVar21 = (*pPVar5->after)(&pPVar5->pqb,(PacketQueueNode *)pPVar5,true);
    }
    if (pPVar21 == (PktIn *)0x0) {
      return;
    }
    uVar11 = pPVar21->type;
    if (uVar11 != 3) {
      pSVar28 = ppl->ssh;
      pcVar16 = ssh1_pkt_type(uVar11);
      pcVar29 = "Received unexpected packet in response to initial public key packet, type %d (%s)";
      goto LAB_0012f25a;
    }
    src = pPVar21->binarysource_;
    bVar10 = BinarySource_get_byte(src);
    *(uint *)&ppl[-2].ic_process_queue.queued = (uint)bVar10;
    pVar31 = BinarySource_get_data(src,8);
    pmVar23 = BinarySource_get_mp_ssh1(src);
    ppl[-1].selfptr = (PacketProtocolLayer **)pmVar23;
    uVar14 = BinarySource_get_uint32(src);
    *(int *)&ppl[-2].out_pq = (int)uVar14;
    if (pPVar21->binarysource_[0].err != BSE_NO_ERROR) {
      pSVar28 = ppl->ssh;
      pcVar16 = "Unable to parse session key packet";
LAB_0012f124:
      ssh_proto_error(pSVar28,pcVar16);
      return;
    }
    puVar2 = &ppl[-2].ic_process_queue.field_0x14;
    pl2.len = 8;
    pl2.ptr = puVar2;
    _Var9 = ptrlen_eq_ptrlen(pVar31,pl2);
    if (!_Var9) {
      pSVar28 = ppl->ssh;
      pcVar16 = "Client sent incorrect anti-spoofing cookie";
      goto LAB_0012f124;
    }
    uVar17 = (ulong)*(uint *)&ppl[-2].ic_process_queue.queued;
    if ((0x1f < uVar17) || (((ulong)ppl[-2].ic_process_queue.fn >> (uVar17 & 0x3f) & 1) == 0)) {
      pSVar28 = ppl->ssh;
      pcVar16 = "Client selected an unsupported cipher";
      goto LAB_0012f124;
    }
    outbuf = strbuf_new_nm();
    sVar18 = mp_get_nbits(*(mp_int **)((long)ppl[-1].ic_process_queue.ctx + 8));
    sVar19 = mp_get_nbits(*(mp_int **)(ppl[-1].ic_process_queue.fn + 8));
    pRVar24 = *(RSAKey **)((long)ppl + (ulong)(sVar18 <= sVar19) * 8 + -0x48);
    _Var9 = rsa_ssh1_decrypt_pkcs1
                      ((mp_int *)ppl[-1].selfptr,
                       *(RSAKey **)((long)ppl + (ulong)(sVar19 < sVar18) * 8 + -0x48),outbuf);
    if (_Var9) {
      mp_free((mp_int *)ppl[-1].selfptr);
      pVar31.ptr = outbuf->u;
      pVar31.len = outbuf->len;
      pmVar23 = mp_from_bytes_be(pVar31);
      ppl[-1].selfptr = (PacketProtocolLayer **)pmVar23;
      strbuf_shrink_to(outbuf,0);
      _Var9 = rsa_ssh1_decrypt_pkcs1((mp_int *)ppl[-1].selfptr,pRVar24,outbuf);
      if ((_Var9) && (outbuf->len == 0x20)) {
        puVar25 = outbuf->u;
        uVar6 = *(undefined8 *)puVar25;
        uVar7 = *(undefined8 *)(puVar25 + 8);
        uVar8 = *(undefined8 *)(puVar25 + 0x18);
        *(undefined8 *)((long)&ppl[-2].seat + 4) = *(undefined8 *)(puVar25 + 0x10);
        *(undefined8 *)((long)&ppl[-2].interactor + 4) = uVar8;
        *(undefined8 *)((long)&ppl[-2].selfptr + 4) = uVar6;
        *(undefined8 *)((long)&ppl[-2].logctx + 4) = uVar7;
        mp_free((mp_int *)ppl[-1].selfptr);
        ppl[-1].selfptr = (PacketProtocolLayer **)0x0;
      }
    }
    strbuf_free(outbuf);
    if (ppl[-1].selfptr != (PacketProtocolLayer **)0x0) {
      pSVar28 = ppl->ssh;
      pcVar16 = "Failed to decrypt session key";
      goto LAB_0012f124;
    }
    ssh1_compute_session_id
              ((uchar *)((long)&ppl[-2].ssh + 4),puVar2,(RSAKey *)ppl[-1].ic_process_queue.ctx,
               (RSAKey *)ppl[-1].ic_process_queue.fn);
    lVar20 = 0;
    do {
      pbVar3 = (byte *)((long)ppl + lVar20 + -0x94);
      *pbVar3 = *pbVar3 ^ *(byte *)((long)ppl + lVar20 + -0x74);
      lVar20 = lVar20 + 1;
    } while (lVar20 != 0x10);
    iVar12 = *(int *)&ppl[-2].ic_process_queue.queued;
    if (iVar12 == 2) {
      cipher = &ssh_des;
    }
    else {
      cipher = &ssh_3des_ssh1;
    }
    if (iVar12 == 6) {
      cipher = &ssh_blowfish_ssh1;
    }
    ssh1_bpp_new_cipher(ppl->bpp,cipher,(void *)((long)&ppl[-2].selfptr + 4));
    pPVar27 = (*ppl->bpp->vt->new_pktout)(0xe);
    pq_base_push(&ppl->out_pq->pqb,&pPVar27->qnode);
    *(undefined4 *)&ppl[-2].vt = 0xfd;
  }
  else {
    if (iVar12 == 0xaf) goto LAB_0012eeb2;
    if (iVar12 != 0xfd) goto LAB_0012ed2b;
  }
  _Var9 = ssh1_common_filter_queue(ppl);
  if (_Var9) {
    pPVar21 = (PktIn *)0x0;
  }
  else {
    pPVar5 = ppl->in_pq;
    pPVar21 = (*pPVar5->after)(&pPVar5->pqb,(PacketQueueNode *)pPVar5,true);
  }
  if (pPVar21 == (PktIn *)0x0) {
    return;
  }
  uVar11 = pPVar21->type;
  if (uVar11 != 4) {
    pSVar28 = ppl->ssh;
    pcVar16 = ssh1_pkt_type(uVar11);
    pcVar29 = "Received unexpected packet while expecting username, type %d (%s)";
LAB_0012f25a:
    ssh_proto_error(pSVar28,pcVar29,(ulong)uVar11,pcVar16);
    return;
  }
  pVar31 = BinarySource_get_string(pPVar21->binarysource_);
  ppl[-1].in_pq = (PktInQueue *)pVar31.ptr;
  ppl[-1].out_pq = (PktOutQueue *)pVar31.len;
  pBVar15 = (BinaryPacketProtocol *)mkstr(pVar31);
  ppl[-1].bpp = pBVar15;
  ppl[-1].in_pq = (PktInQueue *)pBVar15;
  pLVar4 = ppl->logctx;
  uVar11 = string_length_for_printf((size_t)ppl[-1].out_pq);
  pcVar16 = dupprintf("Received username \'%.*s\'",(ulong)uVar11,ppl[-1].in_pq);
  logevent_and_free(pLVar4,pcVar16);
  username.ptr = ppl[-1].in_pq;
  username.len = (size_t)ppl[-1].out_pq;
  _Var9 = auth_none((AuthPolicy *)ppl[-1].logctx,username);
LAB_0012f213:
  if (_Var9 != false) {
LAB_0012f66c:
    username_03.ptr = ppl[-1].in_pq;
    username_03.len = (size_t)ppl[-1].out_pq;
    _Var9 = auth_successful((AuthPolicy *)ppl[-1].logctx,username_03,
                            *(uint *)((long)&ppl[-1].seat + 4));
    if (_Var9) {
      pPVar27 = (*ppl->bpp->vt->new_pktout)(0xe);
      pq_base_push(&ppl->out_pq->pqb,&pPVar27->qnode);
      ssh1_connection_set_protoflags
                ((PacketProtocolLayer *)ppl[-2].bpp,*(int *)((long)&ppl[-2].out_pq + 4),
                 *(int *)&ppl[-2].out_pq);
      pBVar15 = ppl[-2].bpp;
      ppl[-2].bpp = (BinaryPacketProtocol *)0x0;
      ssh_ppl_replace(ppl,(PacketProtocolLayer *)pBVar15);
      return;
    }
    ssh_sw_abort(ppl->ssh,"Multiple authentications required but SSH-1 cannot perform them");
    return;
  }
LAB_0012f284:
  pPVar27 = (*ppl->bpp->vt->new_pktout)(0xf);
  pq_base_push(&ppl->out_pq->pqb,&pPVar27->qnode);
  *(undefined4 *)&ppl[-2].vt = 0x110;
LAB_0012f2aa:
  _Var9 = ssh1_common_filter_queue(ppl);
  pPVar21 = (PktIn *)0x0;
  if (!_Var9) {
    pPVar5 = ppl->in_pq;
    pPVar21 = (*pPVar5->after)(&pPVar5->pqb,(PacketQueueNode *)pPVar5,true);
  }
  if (pPVar21 == (PktIn *)0x0) {
    return;
  }
  iVar12 = pPVar21->type;
  if (0x26 < iVar12) {
    if ((iVar12 != 0x27) && (iVar12 != 0x46)) goto LAB_0012f284;
    uVar11 = (uint)(iVar12 != 0x27) * 0x10 + 0x10;
    *(uint *)((long)&ppl[-1].seat + 4) = uVar11;
    if (((*(uint *)&ppl[-1].seat & uVar11) == 0) ||
       (username_01.ptr = ppl[-1].in_pq, username_01.len = (size_t)ppl[-1].out_pq,
       pcVar16 = auth_ssh1int_challenge((AuthPolicy *)ppl[-1].logctx,uVar11,username_01),
       pcVar16 == (char *)0x0)) goto LAB_0012f284;
    iVar12 = 0x47;
    if (*(int *)((long)&ppl[-1].seat + 4) == 0x10) {
      iVar12 = 0x28;
    }
    pPVar27 = (*ppl->bpp->vt->new_pktout)(iVar12);
    BinarySink_put_stringz(pPVar27->binarysink_,pcVar16);
    pq_base_push(&ppl->out_pq->pqb,&pPVar27->qnode);
    safefree(pcVar16);
    *(undefined4 *)&ppl[-2].vt = 0x192;
LAB_0012f1bc:
    _Var9 = ssh1_common_filter_queue(ppl);
    pPVar21 = (PktIn *)0x0;
    if (!_Var9) {
      pPVar5 = ppl->in_pq;
      pPVar21 = (*pPVar5->after)(&pPVar5->pqb,(PacketQueueNode *)pPVar5,true);
    }
    if (pPVar21 == (PktIn *)0x0) {
      return;
    }
    iVar12 = *(int *)((long)&ppl[-1].seat + 4);
    uVar11 = 0x48;
    if (iVar12 == 0x10) {
      uVar11 = 0x29;
    }
    type = pPVar21->type;
    if (type != uVar11) {
      pSVar28 = ppl->ssh;
      pcVar16 = "CryptoCard";
      if (iVar12 == 0x10) {
        pcVar16 = "TIS";
      }
      pcVar29 = ssh1_pkt_type(type);
      ssh_proto_error(pSVar28,"Received unexpected packet in response to %s challenge, type %d (%s)"
                      ,pcVar16,(ulong)type,pcVar29);
      return;
    }
    pVar31 = BinarySource_get_string(pPVar21->binarysource_);
    _Var9 = auth_ssh1int_response((AuthPolicy *)ppl[-1].logctx,pVar31);
    goto LAB_0012f213;
  }
  if (iVar12 != 6) {
    if ((iVar12 == 9) &&
       (*(undefined4 *)((long)&ppl[-1].seat + 4) = 2, ((ulong)ppl[-1].seat & 2) != 0)) {
      pVar31 = BinarySource_get_string(pPVar21->binarysource_);
      __s = pVar31.ptr;
      pvVar22 = memchr(__s,0,pVar31.len);
      sVar30 = (long)pvVar22 - (long)__s;
      if (pvVar22 == (void *)0x0) {
        sVar30 = pVar31.len;
      }
      username_00.ptr = ppl[-1].in_pq;
      username_00.len = (size_t)ppl[-1].out_pq;
      password.len = sVar30;
      password.ptr = __s;
      iVar12 = auth_password((AuthPolicy *)ppl[-1].logctx,username_00,password,(ptrlen *)0x0);
      if (iVar12 != 0) goto LAB_0012f66c;
    }
    goto LAB_0012f284;
  }
  *(undefined4 *)((long)&ppl[-1].seat + 4) = 4;
  if (((ulong)ppl[-1].seat & 4) == 0) goto LAB_0012f284;
  pmVar23 = BinarySource_get_mp_ssh1(pPVar21->binarysource_);
  username_02.ptr = ppl[-1].in_pq;
  username_02.len = (size_t)ppl[-1].out_pq;
  pRVar24 = auth_publickey_ssh1((AuthPolicy *)ppl[-1].logctx,username_02,pmVar23);
  *(RSAKey **)&ppl[-1].remote_bugs = pRVar24;
  if ((pRVar24 == (RSAKey *)0x0) &&
     (*(char *)((long)&ppl[-2].in_pq[3].pqb.end.formal_size + 2) == '\x01')) {
    lo = mp_from_integer(0);
    x = mp_random_in_range_fn(lo,pmVar23,random_read);
    pPVar27 = (*ppl->bpp->vt->new_pktout)(7);
    BinarySink_put_mp_ssh1(pPVar27->binarysink_,x);
    pq_base_push(&ppl->out_pq->pqb,&pPVar27->qnode);
    mp_free(lo);
    mp_free(x);
  }
  mp_free(pmVar23);
  lVar20 = *(long *)&ppl[-1].remote_bugs;
  if (lVar20 == 0) {
    if (*(char *)((long)&ppl[-2].in_pq[3].pqb.end.formal_size + 2) != '\x01') goto LAB_0012f284;
  }
  else {
    pcVar16 = "Auth key far too small";
    if (*(int *)(lVar20 + 4) < 0x20) goto LAB_0012f26e;
    if (lVar20 != 0) {
      puVar25 = (uchar *)safemalloc((long)*(int *)(lVar20 + 4),1,0);
      random_read(puVar25,0x20);
      psVar26 = md5_new(&ssh_md5);
      if (psVar26 != (ssh_hash *)0x0) {
        (*psVar26->vt->reset)(psVar26);
      }
      BinarySink_put_data(psVar26->binarysink_,puVar25,0x20);
      BinarySink_put_data(psVar26->binarysink_,(void *)((long)&ppl[-2].ssh + 4),0x10);
      (*psVar26->vt->digest)(psVar26,(uchar *)&ppl[-1].interactor);
      (*psVar26->vt->free)(psVar26);
      _Var9 = rsa_ssh1_encrypt(puVar25,0x20,*(RSAKey **)&ppl[-1].remote_bugs);
      if (_Var9) {
        bytes.len = (size_t)*(int *)(*(long *)&ppl[-1].remote_bugs + 4);
        bytes.ptr = puVar25;
        pmVar23 = mp_from_bytes_be(bytes);
        smemclr(puVar25,(long)*(int *)(*(long *)&ppl[-1].remote_bugs + 4));
        safefree(puVar25);
        pPVar27 = (*ppl->bpp->vt->new_pktout)(7);
        BinarySink_put_mp_ssh1(pPVar27->binarysink_,pmVar23);
        pq_base_push(&ppl->out_pq->pqb,&pPVar27->qnode);
        mp_free(pmVar23);
        goto LAB_0012f5ef;
      }
      safefree(puVar25);
      pLVar4 = ppl->logctx;
      pcVar16 = dupprintf("Failed to encrypt auth challenge");
      logevent_and_free(pLVar4,pcVar16);
      goto LAB_0012f284;
    }
  }
LAB_0012f5ef:
  *(undefined4 *)&ppl[-2].vt = 0x164;
LAB_0012f5f9:
  _Var9 = ssh1_common_filter_queue(ppl);
  pPVar21 = (PktIn *)0x0;
  if (!_Var9) {
    pPVar5 = ppl->in_pq;
    pPVar21 = (*pPVar5->after)(&pPVar5->pqb,(PacketQueueNode *)pPVar5,true);
  }
  if (pPVar21 == (PktIn *)0x0) {
    return;
  }
  uVar11 = pPVar21->type;
  if (uVar11 != 8) {
    pSVar28 = ppl->ssh;
    pcVar16 = ssh1_pkt_type(uVar11);
    pcVar29 = "Received unexpected packet in response to RSA auth challenge, type %d (%s)";
    goto LAB_0012f25a;
  }
  if (*(long *)&ppl[-1].remote_bugs == 0) goto LAB_0012f284;
  pVar31 = BinarySource_get_data(pPVar21->binarysource_,0x10);
  pl2_00.len = 0x10;
  pl2_00.ptr = &ppl[-1].interactor;
  _Var9 = ptrlen_eq_ptrlen(pVar31,pl2_00);
  pcVar16 = "Wrong response to auth challenge";
  if (_Var9) goto LAB_0012f66c;
LAB_0012f26e:
  pLVar4 = ppl->logctx;
  pcVar16 = dupprintf(pcVar16);
  logevent_and_free(pLVar4,pcVar16);
  goto LAB_0012f284;
}

Assistant:

static void ssh1_login_server_process_queue(PacketProtocolLayer *ppl)
{
    struct ssh1_login_server_state *s =
        container_of(ppl, struct ssh1_login_server_state, ppl);
    PktIn *pktin;
    PktOut *pktout;
    int i;

    /* Filter centrally handled messages off the front of the queue on
     * every entry to this coroutine, no matter where we're resuming
     * from, even if we're _not_ looping on pq_pop. That way we can
     * still proactively handle those messages even if we're waiting
     * for a user response. */
    if (ssh1_login_server_filter_queue(s))
        return;

    crBegin(s->crState);

    if (!s->servkey) {
        int server_key_bits = s->hostkey->bytes - 256;
        if (server_key_bits < 512)
            server_key_bits = s->hostkey->bytes + 256;
        s->servkey = snew(RSAKey);

        PrimeGenerationContext *pgc = primegen_new_context(
            &primegen_probabilistic);
        ProgressReceiver null_progress;
        null_progress.vt = &null_progress_vt;
        rsa_generate(s->servkey, server_key_bits, false, pgc, &null_progress);
        primegen_free_context(pgc);

        s->servkey->comment = NULL;
        s->servkey_generated_here = true;
    }

    s->local_protoflags = SSH1_PROTOFLAGS_SUPPORTED;
    s->supported_ciphers_mask = s->ssc->ssh1_cipher_mask;
    s->supported_auths_mask = 0;
    s->ap_methods = auth_methods(s->authpolicy);
    if (s->ap_methods & AUTHMETHOD_PASSWORD)
        s->supported_auths_mask |= (1U << SSH1_AUTH_PASSWORD);
    if (s->ap_methods & AUTHMETHOD_PUBLICKEY)
        s->supported_auths_mask |= (1U << SSH1_AUTH_RSA);
    if (s->ap_methods & AUTHMETHOD_TIS)
        s->supported_auths_mask |= (1U << SSH1_AUTH_TIS);
    if (s->ap_methods & AUTHMETHOD_CRYPTOCARD)
        s->supported_auths_mask |= (1U << SSH1_AUTH_CCARD);

    random_read(s->cookie, 8);

    pktout = ssh_bpp_new_pktout(s->ppl.bpp, SSH1_SMSG_PUBLIC_KEY);
    put_data(pktout, s->cookie, 8);
    rsa_ssh1_public_blob(BinarySink_UPCAST(pktout),
                         s->servkey, RSA_SSH1_EXPONENT_FIRST);
    rsa_ssh1_public_blob(BinarySink_UPCAST(pktout),
                         s->hostkey, RSA_SSH1_EXPONENT_FIRST);
    put_uint32(pktout, s->local_protoflags);
    put_uint32(pktout, s->supported_ciphers_mask);
    put_uint32(pktout, s->supported_auths_mask);
    pq_push(s->ppl.out_pq, pktout);

    crMaybeWaitUntilV((pktin = ssh1_login_server_pop(s)) != NULL);
    if (pktin->type != SSH1_CMSG_SESSION_KEY) {
        ssh_proto_error(s->ppl.ssh, "Received unexpected packet in response"
                        " to initial public key packet, type %d (%s)",
                        pktin->type, ssh1_pkt_type(pktin->type));
        return;
    }

    {
        ptrlen client_cookie;
        s->cipher_type = get_byte(pktin);
        client_cookie = get_data(pktin, 8);
        s->sesskey = get_mp_ssh1(pktin);
        s->remote_protoflags = get_uint32(pktin);

        if (get_err(pktin)) {
            ssh_proto_error(s->ppl.ssh, "Unable to parse session key packet");
            return;
        }
        if (!ptrlen_eq_ptrlen(client_cookie, make_ptrlen(s->cookie, 8))) {
            ssh_proto_error(s->ppl.ssh,
                            "Client sent incorrect anti-spoofing cookie");
            return;
        }
    }
    if (s->cipher_type >= 32 ||
        !((s->supported_ciphers_mask >> s->cipher_type) & 1)) {
        ssh_proto_error(s->ppl.ssh, "Client selected an unsupported cipher");
        return;
    }

    {
        RSAKey *smaller, *larger;
        strbuf *data = strbuf_new_nm();

        if (mp_get_nbits(s->hostkey->modulus) >
            mp_get_nbits(s->servkey->modulus)) {
            larger = s->hostkey;
            smaller = s->servkey;
        } else {
            smaller = s->hostkey;
            larger = s->servkey;
        }

        if (rsa_ssh1_decrypt_pkcs1(s->sesskey, larger, data)) {
            mp_free(s->sesskey);
            s->sesskey = mp_from_bytes_be(ptrlen_from_strbuf(data));
            strbuf_clear(data);
            if (rsa_ssh1_decrypt_pkcs1(s->sesskey, smaller, data) &&
                data->len == sizeof(s->session_key)) {
                memcpy(s->session_key, data->u, sizeof(s->session_key));
                mp_free(s->sesskey);
                s->sesskey = NULL;     /* indicates success */
            }
        }

        strbuf_free(data);
    }
    if (s->sesskey) {
        ssh_proto_error(s->ppl.ssh, "Failed to decrypt session key");
        return;
    }

    ssh1_compute_session_id(s->session_id, s->cookie, s->hostkey, s->servkey);

    for (i = 0; i < 16; i++)
        s->session_key[i] ^= s->session_id[i];

    {
        const ssh_cipheralg *cipher =
            (s->cipher_type == SSH1_CIPHER_BLOWFISH ? &ssh_blowfish_ssh1 :
             s->cipher_type == SSH1_CIPHER_DES ? &ssh_des : &ssh_3des_ssh1);
        ssh1_bpp_new_cipher(s->ppl.bpp, cipher, s->session_key);
    }

    pktout = ssh_bpp_new_pktout(s->ppl.bpp, SSH1_SMSG_SUCCESS);
    pq_push(s->ppl.out_pq, pktout);

    crMaybeWaitUntilV((pktin = ssh1_login_server_pop(s)) != NULL);
    if (pktin->type != SSH1_CMSG_USER) {
        ssh_proto_error(s->ppl.ssh, "Received unexpected packet while "
                        "expecting username, type %d (%s)",
                        pktin->type, ssh1_pkt_type(pktin->type));
        return;
    }
    s->username = get_string(pktin);
    s->username.ptr = s->username_str = mkstr(s->username);
    ppl_logevent("Received username '%.*s'", PTRLEN_PRINTF(s->username));

    if (auth_none(s->authpolicy, s->username))
        goto auth_success;

    while (1) {
        /* Signal failed authentication */
        pktout = ssh_bpp_new_pktout(s->ppl.bpp, SSH1_SMSG_FAILURE);
        pq_push(s->ppl.out_pq, pktout);

        crMaybeWaitUntilV((pktin = ssh1_login_server_pop(s)) != NULL);
        if (pktin->type == SSH1_CMSG_AUTH_PASSWORD) {
            s->current_method = AUTHMETHOD_PASSWORD;
            if (!(s->ap_methods & s->current_method))
                continue;

            ptrlen password = get_string(pktin);

            /* Tolerate historic traffic-analysis defence of NUL +
             * garbage on the end of the binary password string */
            char *nul = memchr(password.ptr, '\0', password.len);
            if (nul)
                password.len = (const char *)nul - (const char *)password.ptr;

            if (auth_password(s->authpolicy, s->username, password, NULL))
                goto auth_success;
        } else if (pktin->type == SSH1_CMSG_AUTH_RSA) {
            s->current_method = AUTHMETHOD_PUBLICKEY;
            if (!(s->ap_methods & s->current_method))
                continue;

            {
                mp_int *modulus = get_mp_ssh1(pktin);
                s->authkey = auth_publickey_ssh1(
                    s->authpolicy, s->username, modulus);

                if (!s->authkey &&
                    s->ssc->stunt_pretend_to_accept_any_pubkey) {
                    mp_int *zero = mp_from_integer(0);
                    mp_int *fake_challenge = mp_random_in_range(zero, modulus);

                    pktout = ssh_bpp_new_pktout(
                        s->ppl.bpp, SSH1_SMSG_AUTH_RSA_CHALLENGE);
                    put_mp_ssh1(pktout, fake_challenge);
                    pq_push(s->ppl.out_pq, pktout);

                    mp_free(zero);
                    mp_free(fake_challenge);
                }

                mp_free(modulus);
            }

            if (!s->authkey &&
                !s->ssc->stunt_pretend_to_accept_any_pubkey)
                continue;

            if (s->authkey && s->authkey->bytes < 32) {
                ppl_logevent("Auth key far too small");
                continue;
            }

            if (s->authkey) {
                unsigned char *rsabuf =
                    snewn(s->authkey->bytes, unsigned char);

                random_read(rsabuf, 32);

                {
                    ssh_hash *h = ssh_hash_new(&ssh_md5);
                    put_data(h, rsabuf, 32);
                    put_data(h, s->session_id, 16);
                    ssh_hash_final(h, s->auth_rsa_expected_response);
                }

                if (!rsa_ssh1_encrypt(rsabuf, 32, s->authkey)) {
                    sfree(rsabuf);
                    ppl_logevent("Failed to encrypt auth challenge");
                    continue;
                }

                mp_int *bn = mp_from_bytes_be(
                    make_ptrlen(rsabuf, s->authkey->bytes));
                smemclr(rsabuf, s->authkey->bytes);
                sfree(rsabuf);

                pktout = ssh_bpp_new_pktout(
                    s->ppl.bpp, SSH1_SMSG_AUTH_RSA_CHALLENGE);
                put_mp_ssh1(pktout, bn);
                pq_push(s->ppl.out_pq, pktout);

                mp_free(bn);
            }

            crMaybeWaitUntilV((pktin = ssh1_login_server_pop(s)) != NULL);
            if (pktin->type != SSH1_CMSG_AUTH_RSA_RESPONSE) {
                ssh_proto_error(s->ppl.ssh, "Received unexpected packet in "
                                "response to RSA auth challenge, type %d (%s)",
                                pktin->type, ssh1_pkt_type(pktin->type));
                return;
            }

            if (!s->authkey)
                continue;

            {
                ptrlen response = get_data(pktin, 16);
                ptrlen expected = make_ptrlen(
                    s->auth_rsa_expected_response, 16);
                if (!ptrlen_eq_ptrlen(response, expected)) {
                    ppl_logevent("Wrong response to auth challenge");
                    continue;
                }
            }

            goto auth_success;
        } else if (pktin->type == SSH1_CMSG_AUTH_TIS ||
                   pktin->type == SSH1_CMSG_AUTH_CCARD) {
            char *challenge;
            unsigned response_type;
            ptrlen response;

            s->current_method = (pktin->type == SSH1_CMSG_AUTH_TIS ?
                                 AUTHMETHOD_TIS : AUTHMETHOD_CRYPTOCARD);
            if (!(s->ap_methods & s->current_method))
                continue;

            challenge = auth_ssh1int_challenge(
                s->authpolicy, s->current_method, s->username);
            if (!challenge)
                continue;
            pktout = ssh_bpp_new_pktout(
                s->ppl.bpp,
                (s->current_method == AUTHMETHOD_TIS ?
                 SSH1_SMSG_AUTH_TIS_CHALLENGE :
                 SSH1_SMSG_AUTH_CCARD_CHALLENGE));
            put_stringz(pktout, challenge);
            pq_push(s->ppl.out_pq, pktout);
            sfree(challenge);

            crMaybeWaitUntilV((pktin = ssh1_login_server_pop(s)) != NULL);
            response_type = (s->current_method == AUTHMETHOD_TIS ?
                             SSH1_CMSG_AUTH_TIS_RESPONSE :
                             SSH1_CMSG_AUTH_CCARD_RESPONSE);
            if (pktin->type != response_type) {
                ssh_proto_error(s->ppl.ssh, "Received unexpected packet in "
                                "response to %s challenge, type %d (%s)",
                                (s->current_method == AUTHMETHOD_TIS ?
                                 "TIS" : "CryptoCard"),
                                pktin->type, ssh1_pkt_type(pktin->type));
                return;
            }

            response = get_string(pktin);

            if (auth_ssh1int_response(s->authpolicy, response))
                goto auth_success;
        }
    }

  auth_success:
    if (!auth_successful(s->authpolicy, s->username, s->current_method)) {
        ssh_sw_abort(s->ppl.ssh, "Multiple authentications required but SSH-1"
                     " cannot perform them");
        return;
    }

    /* Signal successful authentication */
    pktout = ssh_bpp_new_pktout(s->ppl.bpp, SSH1_SMSG_SUCCESS);
    pq_push(s->ppl.out_pq, pktout);

    ssh1_connection_set_protoflags(
        s->successor_layer, s->local_protoflags, s->remote_protoflags);
    {
        PacketProtocolLayer *successor = s->successor_layer;
        s->successor_layer = NULL;     /* avoid freeing it ourself */
        ssh_ppl_replace(&s->ppl, successor);
        return;   /* we've just freed s, so avoid even touching s->crState */
    }

    crFinishV;
}